

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStringAttribute.cpp
# Opt level: O2

void __thiscall
Imf_2_5::
TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
readValueFrom(TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,IStream *is,int size,int version)

{
  ulong uVar1;
  ulong uVar2;
  
  std::__cxx11::string::resize((ulong)&this->_value);
  uVar1 = 0;
  uVar2 = (ulong)(uint)size;
  if (size < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    (*is->_vptr_IStream[3])(is,(this->_value)._M_dataplus._M_p + uVar1,1);
  }
  return;
}

Assistant:

void
StringAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int size, int version)
{
    _value.resize (size);

    for (int i = 0; i < size; i++)
	Xdr::read <StreamIO> (is, _value[i]);
}